

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPCompoundPacket::ClearPacketList(RTCPCompoundPacket *this)

{
  RTCPPacket *obj;
  bool bVar1;
  reference ppRVar2;
  RTPMemoryManager *mgr;
  iterator local_50;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_48;
  _List_node_base *local_40;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_20;
  _List_const_iterator<jrtplib::RTCPPacket_*> local_18;
  const_iterator it;
  RTCPCompoundPacket *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::begin
                 (&this->rtcppacklist);
  std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::end
                   (&this->rtcppacklist);
    std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppRVar2 = std::_List_const_iterator<jrtplib::RTCPPacket_*>::operator*(&local_18);
    obj = *ppRVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTCPPacket>(obj,mgr);
    local_40 = (_List_node_base *)
               std::_List_const_iterator<jrtplib::RTCPPacket_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::clear
            (&this->rtcppacklist);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::begin
                 (&this->rtcppacklist);
  std::_List_const_iterator<jrtplib::RTCPPacket_*>::_List_const_iterator(&local_48,&local_50);
  (this->rtcppackit)._M_node = local_48._M_node;
  return;
}

Assistant:

void RTCPCompoundPacket::ClearPacketList()
{
	std::list<RTCPPacket *>::const_iterator it;

	for (it = rtcppacklist.begin() ; it != rtcppacklist.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	rtcppacklist.clear();
	rtcppackit = rtcppacklist.begin();
}